

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O3

satoko_t * Gia_ManSatokoCreate(Gia_Man_t *p,satoko_opts_t *opts)

{
  int iVar1;
  Cnf_Dat_t *pCnf;
  satoko_t *s;
  
  pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,1,0,0);
  s = Gia_ManSatokoInit(pCnf,opts);
  if (s == (satoko_t *)0x0) {
    Cnf_DataFree(pCnf);
  }
  else {
    iVar1 = satoko_simplify(s);
    Cnf_DataFree(pCnf);
    if (iVar1 == 1) {
      return s;
    }
    satoko_destroy(s);
  }
  return (satoko_t *)0x0;
}

Assistant:

satoko_t * Gia_ManSatokoCreate( Gia_Man_t * p, satoko_opts_t * opts )
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 1, 0, 0 );
    satoko_t * pSat = Gia_ManSatokoInit( pCnf, opts );
    int status = pSat ? satoko_simplify(pSat) : SATOKO_OK;
    Cnf_DataFree( pCnf );
    if ( status == SATOKO_OK )
        return pSat;
    satoko_destroy( pSat );
    return NULL;
}